

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void deqp::gls::ub::anon_unknown_12::generateFullDeclaration
               (ostringstream *src,StructType *structType,int indentLevel)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  pointer pSVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"struct",6);
  if (((structType->m_typeName)._M_string_length != 0) &&
     ((structType->m_typeName)._M_dataplus._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
    __s = (structType->m_typeName)._M_dataplus._M_p;
    if (__s == (char *)0x0 || (structType->m_typeName)._M_string_length == 0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,__s,sVar1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\n",1);
  iVar2 = indentLevel;
  if (0 < indentLevel) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\t",1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"{\n",2);
  pSVar3 = (structType->m_members).
           super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (structType->m_members).
                super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar2 = indentLevel + 1;
      if ((uint)indentLevel < 0x7fffffff) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\t",1);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      generateDeclaration(src,&pSVar3->m_type,(pSVar3->m_name)._M_dataplus._M_p,indentLevel + 1,
                          pSVar3->m_flags & 0xc00);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != (structType->m_members).
                       super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (0 < indentLevel) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\t",1);
      indentLevel = indentLevel + -1;
    } while (indentLevel != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"}",1);
  return;
}

Assistant:

void generateFullDeclaration (std::ostringstream& src, const StructType& structType, int indentLevel)
{
	src << "struct";
	if (structType.getTypeName())
		src << " " << structType.getTypeName();
	src << "\n" << Indent(indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = structType.begin(); memberIter != structType.end(); memberIter++)
	{
		src << Indent(indentLevel+1);
		generateDeclaration(src, memberIter->getType(), memberIter->getName(), indentLevel+1, memberIter->getFlags() & UNUSED_BOTH);
	}

	src << Indent(indentLevel) << "}";
}